

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O2

QString * qt_accStripAmp(QString *__return_storage_ptr__,QString *text)

{
  qsizetype qVar1;
  long from;
  QArrayDataPointer<char16_t> *other;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d = (text->d).d;
  local_40.ptr = (text->d).ptr;
  local_40.size = (text->d).size;
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_40.size != 0) {
    from = 0;
    while( true ) {
      qVar1 = QString::indexOf((QString *)&local_40,(QChar)0x26,from,CaseSensitive);
      if (qVar1 == -1) break;
      from = qVar1 + 1;
      if (from < local_40.size) {
        if (local_40.ptr[qVar1 + 1] != L'&') {
          QString::remove((longlong)&local_40,qVar1);
          break;
        }
        from = qVar1 + 2;
      }
    }
  }
  other = (QArrayDataPointer<char16_t> *)
          QString::replace((QLatin1String *)&local_40,(QLatin1String *)0x2,0x6589a4);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,other);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString qt_accStripAmp(const QString &text)
{
    QString newText(text);
    qsizetype ampIndex = qt_accAmpIndex(newText);
    if (ampIndex != -1)
        newText.remove(ampIndex, 1);

    return newText.replace("&&"_L1, "&"_L1);
}